

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PushConstantComputeTestInstance *this)

{
  VkResult VVar1;
  int iVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  TestStatus *pTVar5;
  allocator_type local_c1;
  TestStatus *local_c0;
  string local_b8;
  VkQueue local_98;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> expectValue;
  VkSubmitInfo submitInfo;
  
  local_c0 = __return_storage_ptr__;
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  local_98 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar1 = (*pDVar3->_vptr_DeviceInterface[0x14])(pDVar3,pVVar4,1,&this->m_fence);
  ::vk::checkResult(VVar1,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60c);
  VVar1 = (*pDVar3->_vptr_DeviceInterface[2])
                    (pDVar3,local_98,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60d);
  VVar1 = (*pDVar3->_vptr_DeviceInterface[0x16])
                    (pDVar3,pVVar4,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x60e);
  local_b8._M_dataplus._M_p = (pointer)0x3f800000;
  local_b8._M_string_length = 0x3f80000000000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&expectValue,8,(value_type *)&local_b8,&local_c1);
  iVar2 = bcmp(expectValue.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               ((this->m_outBufferAlloc).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,0x80);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"result image matches with reference",
               (allocator<char> *)&local_c1);
    pTVar5 = local_c0;
    tcu::TestStatus::pass(local_c0,&local_b8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Image mismatch",(allocator<char> *)&local_c1);
    pTVar5 = local_c0;
    tcu::TestStatus::fail(local_c0,&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&expectValue.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return pTVar5;
}

Assistant:

tcu::TestStatus PushConstantComputeTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	// verify result
	std::vector<tcu::Vec4>	expectValue(8, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	if (deMemCmp((void*)(&expectValue[0]), m_outBufferAlloc->getHostPtr(), (size_t)(sizeof(tcu::Vec4) * 8)))
	{
		return tcu::TestStatus::fail("Image mismatch");
	}
	return tcu::TestStatus::pass("result image matches with reference");
}